

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

void __thiscall
pbrt::ImageTextureBase::ImageTextureBase
          (ImageTextureBase *this,TextureMapping2DHandle *mapping,string *filename,string *filter,
          Float maxAniso,WrapMode wrapMode,Float scale,ColorEncodingHandle *encoding,Allocator alloc
          )

{
  MIPMap *pMVar1;
  ColorEncodingHandle *in_RDX;
  long in_RDI;
  ColorEncodingHandle *in_R9;
  undefined4 in_XMM1_Da;
  ColorEncodingHandle *in_stack_000000c8;
  WrapMode in_stack_000000d0;
  Float in_stack_000000d4;
  string *in_stack_000000d8;
  string *in_stack_000000e0;
  Allocator in_stack_000000e8;
  TextureMapping2DHandle *in_stack_ffffffffffffff90;
  
  TextureMapping2DHandle::TextureMapping2DHandle
            (in_stack_ffffffffffffff90,(TextureMapping2DHandle *)in_R9);
  *(undefined4 *)(in_RDI + 8) = in_XMM1_Da;
  ColorEncodingHandle::ColorEncodingHandle(in_RDX,in_R9);
  pMVar1 = GetTexture(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,
                      in_stack_000000c8,in_stack_000000e8);
  *(MIPMap **)(in_RDI + 0x10) = pMVar1;
  return;
}

Assistant:

ImageTextureBase::ImageTextureBase(TextureMapping2DHandle mapping,
                                   const std::string &filename, const std::string &filter,
                                   Float maxAniso, WrapMode wrapMode, Float scale,
                                   ColorEncodingHandle encoding, Allocator alloc)
    : mapping(std::move(mapping)), scale(scale) {
    mipmap = GetTexture(filename, filter, maxAniso, wrapMode, encoding, alloc);
}